

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O0

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateTag(HtmlparserCppTest *this,string *expected_tag)

{
  bool bVar1;
  char *pcVar2;
  string *expected_tag_local;
  HtmlparserCppTest *this_local;
  
  pcVar2 = HtmlParser::tag(&this->parser_);
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"Check failed: %s\n","parser_.tag() != __null");
    exit(1);
  }
  pcVar2 = HtmlParser::tag(&this->parser_);
  bVar1 = std::operator==(expected_tag,pcVar2);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","expected_tag == parser_.tag()");
    exit(1);
  }
  return;
}

Assistant:

void HtmlparserCppTest::ValidateTag(const string &expected_tag) {
  EXPECT_TRUE(parser_.tag() != NULL);
  EXPECT_TRUE(expected_tag == parser_.tag())
      << "Unexpected attr tag name at line " << parser_.line_number();
}